

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.h
# Opt level: O0

void __thiscall
QPlatformMessageDialogHelper::~QPlatformMessageDialogHelper(QPlatformMessageDialogHelper *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_metaObject_00e184d8;
  QSharedPointer<QMessageDialogOptions>::~QSharedPointer
            ((QSharedPointer<QMessageDialogOptions> *)0x3bccce);
  QPlatformDialogHelper::~QPlatformDialogHelper((QPlatformDialogHelper *)0x3bccd8);
  return;
}

Assistant:

class Q_GUI_EXPORT QPlatformMessageDialogHelper : public QPlatformDialogHelper
{
    Q_OBJECT
public:
    const QSharedPointer<QMessageDialogOptions> &options() const;
    void setOptions(const QSharedPointer<QMessageDialogOptions> &options);

Q_SIGNALS:
    void clicked(QPlatformDialogHelper::StandardButton button, QPlatformDialogHelper::ButtonRole role);
    void checkBoxStateChanged(Qt::CheckState state);

private:
    QSharedPointer<QMessageDialogOptions> m_options;
}